

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

void vera::splitFacesFromHorizontalCross<unsigned_char>
               (uchar *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<unsigned_char> **_faces)

{
  int iVar1;
  CubemapFace<unsigned_char> *pCVar2;
  uchar *puVar3;
  CubemapFace<unsigned_char> **ppCVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int i;
  long lVar10;
  
  iVar6 = (int)(_width >> 2);
  lVar7 = (long)iVar6 * _channels;
  iVar9 = (int)(_height / 3);
  lVar10 = 0;
  do {
    pCVar2 = (CubemapFace<unsigned_char> *)operator_new(0x18);
    pCVar2->id = 0;
    pCVar2->width = 0;
    pCVar2->height = 0;
    pCVar2->currentOffset = 0;
    pCVar2->data = (uchar *)0x0;
    _faces[lVar10] = pCVar2;
    pCVar2->id = (int)lVar10;
    puVar3 = (uchar *)operator_new__(iVar9 * lVar7);
    pCVar2->data = puVar3;
    pCVar2->width = iVar6;
    pCVar2->height = iVar9;
    pCVar2->currentOffset = 0;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  if (_height != 0) {
    iVar6 = (int)lVar7;
    uVar5 = 0;
    do {
      uVar8 = 0;
      lVar7 = 2;
      do {
        iVar1 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                     (long)iVar9);
        lVar10 = lVar7 + -1;
        ppCVar4 = _faces;
        if (((((iVar1 == 1 && lVar7 == 0) || (ppCVar4 = _faces + 1, iVar1 == 1 && lVar7 == 2)) ||
             (ppCVar4 = _faces + 2, iVar1 == 0 && lVar7 == 1)) ||
            (((ppCVar4 = _faces + 3, iVar1 == 2 && lVar7 == 1 ||
              (ppCVar4 = _faces + 4, iVar1 == 1 && lVar7 == 1)) ||
             (ppCVar4 = _faces + 5, lVar7 == -1 && iVar1 == 1)))) &&
           (pCVar2 = *ppCVar4, pCVar2 != (CubemapFace<unsigned_char> *)0x0)) {
          memcpy(pCVar2->data + pCVar2->currentOffset,
                 _data + ((long)(((uVar8 & 0xffffffff) + uVar5 * _width) * (_channels << 0x20)) >>
                         0x20),(long)iVar6);
          pCVar2->currentOffset = pCVar2->currentOffset + iVar6;
        }
        uVar8 = uVar8 + (_width >> 2);
        lVar7 = lVar10;
      } while (lVar10 != -2);
      uVar5 = uVar5 + 1;
    } while (uVar5 != _height);
  }
  return;
}

Assistant:

void splitFacesFromHorizontalCross(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 4;
    int faceHeight = _height / 3;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[_channels * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;

        for (int iFace = 0; iFace < 4; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = _channels * (faceWidth * iFace + l * _width);

            //      0   1   2   3 i      
            //  2      -X 
            //  1  -Y  +Z  +Y  -Z     
            //  0      +X
            //  j
            //
            if (iFace == 2 && jFace == 1) face = _faces[0]; // POS_Y
            if (iFace == 0 && jFace == 1) face = _faces[1]; // NEG_Y
            if (iFace == 1 && jFace == 0) face = _faces[2]; // POS_X
            if (iFace == 1 && jFace == 2) face = _faces[3]; // NEG_X
            if (iFace == 1 && jFace == 1) face = _faces[4]; // POS_Z
            if (iFace == 3 && jFace == 1) face = _faces[5]; // NEG_Z

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * _channels;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (_channels * faceWidth);
            }
        }
    }
}